

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

string * cmSystemTools::ComputeStringMD5(string *__return_storage_ptr__,string *input)

{
  cmCryptoHashMD5 md5;
  cmCryptoHashMD5 cStack_28;
  
  cmCryptoHashMD5::cmCryptoHashMD5(&cStack_28);
  cmCryptoHash::HashString(__return_storage_ptr__,&cStack_28.super_cmCryptoHash,input);
  cmCryptoHashMD5::~cmCryptoHashMD5(&cStack_28);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::ComputeStringMD5(const std::string& input)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  cmCryptoHashMD5 md5;
  return md5.HashString(input);
#else
  (void)input;
  cmSystemTools::Message("md5sum not supported in bootstrapping mode","Error");
  return "";
#endif
}